

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<4,_1,_true,_embree::avx512::SubGridIntersector1Pluecker<4,_true>_>::occluded
               (Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  ushort uVar9;
  ushort uVar10;
  uint uVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined8 uVar14;
  undefined8 uVar15;
  ulong uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  int iVar24;
  long lVar25;
  ulong uVar26;
  Geometry *pGVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  ulong *puVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  Scene *pSVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong unaff_R14;
  size_t mask;
  ulong uVar40;
  bool bVar41;
  bool bVar42;
  float fVar43;
  float fVar75;
  float fVar76;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  float fVar77;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar94;
  float fVar95;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar96;
  float fVar97;
  float fVar98;
  undefined4 uVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  UVIdentity<8> mapUV;
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  PlueckerHitM<8,_embree::avx512::UVIdentity<8>_> hit;
  NodeRef stack [244];
  undefined1 local_b1d;
  float local_b1c;
  ulong local_b18;
  ulong local_b10;
  RTCRayQueryContext *local_b08;
  RTCIntersectArguments *local_b00;
  ulong local_af8;
  ulong local_af0;
  ulong local_ae8;
  Ray *local_ae0;
  RayQueryContext *local_ad8;
  Scene *local_ad0;
  ulong *local_ac8;
  int local_abc;
  Geometry *local_ab8;
  ulong local_ab0;
  ulong local_aa8;
  ulong local_aa0;
  ulong local_a98;
  ulong local_a90;
  ulong local_a88;
  ulong local_a80;
  ulong local_a78;
  ulong local_a70;
  ulong local_a68;
  ulong local_a60;
  long local_a58;
  float local_a50;
  float local_a4c;
  float local_a48;
  undefined4 local_a44;
  undefined4 local_a40;
  undefined4 local_a3c;
  undefined4 local_a38;
  uint local_a34;
  uint local_a30;
  RTCFilterFunctionNArguments local_a20;
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  float local_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 *local_8e0;
  byte local_8d8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  float local_860 [4];
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  uint uStack_844;
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  uint uStack_824;
  float local_820 [4];
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  uint uStack_804;
  ulong local_800 [250];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar46 [16];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar88 = ray->tfar;
    if (0.0 <= fVar88) {
      puVar32 = local_800 + 1;
      aVar8 = (ray->dir).field_0;
      auVar49 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar44._8_4_ = 0x7fffffff;
      auVar44._0_8_ = 0x7fffffff7fffffff;
      auVar44._12_4_ = 0x7fffffff;
      auVar44 = vandps_avx512vl((undefined1  [16])aVar8,auVar44);
      auVar45._8_4_ = 0x219392ef;
      auVar45._0_8_ = 0x219392ef219392ef;
      auVar45._12_4_ = 0x219392ef;
      uVar30 = vcmpps_avx512vl(auVar44,auVar45,1);
      auVar105._8_4_ = 0x3f800000;
      auVar105._0_8_ = &DAT_3f8000003f800000;
      auVar105._12_4_ = 0x3f800000;
      auVar44 = vdivps_avx(auVar105,(undefined1  [16])aVar8);
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar41 = (bool)((byte)uVar30 & 1);
      auVar46._0_4_ = (uint)bVar41 * auVar45._0_4_ | (uint)!bVar41 * auVar44._0_4_;
      bVar41 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar46._4_4_ = (uint)bVar41 * auVar45._4_4_ | (uint)!bVar41 * auVar44._4_4_;
      bVar41 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar46._8_4_ = (uint)bVar41 * auVar45._8_4_ | (uint)!bVar41 * auVar44._8_4_;
      bVar41 = (bool)((byte)(uVar30 >> 3) & 1);
      auVar46._12_4_ = (uint)bVar41 * auVar45._12_4_ | (uint)!bVar41 * auVar44._12_4_;
      auVar47._8_4_ = 0x3f7ffffa;
      auVar47._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar47._12_4_ = 0x3f7ffffa;
      auVar47 = vmulps_avx512vl(auVar46,auVar47);
      auVar48._8_4_ = 0x3f800003;
      auVar48._0_8_ = 0x3f8000033f800003;
      auVar48._12_4_ = 0x3f800003;
      auVar48 = vmulps_avx512vl(auVar46,auVar48);
      auVar44 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar120 = ZEXT1664(auVar44);
      local_800[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar44 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar121 = ZEXT1664(auVar44);
      auVar44 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar122 = ZEXT1664(auVar44);
      bVar41 = auVar47._0_4_ < 0.0;
      auVar44 = vbroadcastss_avx512vl(auVar47);
      auVar123 = ZEXT1664(auVar44);
      auVar44 = vmovshdup_avx(auVar47);
      auVar45 = vshufps_avx512vl(auVar47,auVar47,0x55);
      auVar124 = ZEXT1664(auVar45);
      auVar45 = vshufpd_avx(auVar47,auVar47,1);
      auVar47 = vshufps_avx512vl(auVar47,auVar47,0xaa);
      auVar125 = ZEXT1664(auVar47);
      fVar76 = auVar48._0_4_;
      local_960 = vshufps_avx(auVar48,auVar48,0x55);
      auVar115 = ZEXT1664(local_960);
      local_970 = vshufps_avx(auVar48,auVar48,0xaa);
      auVar116 = ZEXT1664(local_970);
      uVar30 = (ulong)bVar41 << 4;
      uVar33 = (ulong)(auVar44._0_4_ < 0.0) << 4 | 0x20;
      uVar35 = (ulong)(auVar45._0_4_ < 0.0) << 4 | 0x40;
      uVar39 = uVar30 ^ 0x10;
      uVar40 = uVar33 ^ 0x10;
      uVar29 = uVar35 ^ 0x10;
      uVar99 = auVar49._0_4_;
      local_980._4_4_ = uVar99;
      local_980._0_4_ = uVar99;
      local_980._8_4_ = uVar99;
      local_980._12_4_ = uVar99;
      auVar118 = ZEXT1664(local_980);
      local_990._4_4_ = fVar88;
      local_990._0_4_ = fVar88;
      local_990._8_4_ = fVar88;
      local_990._12_4_ = fVar88;
      auVar119 = ZEXT1664(local_990);
      local_a70 = (ulong)(((uint)bVar41 << 4) >> 2);
      local_a78 = uVar39 >> 2;
      local_a80 = uVar33 >> 2;
      local_a88 = uVar40 >> 2;
      local_a90 = uVar35 >> 2;
      local_a98 = uVar29 >> 2;
      fVar88 = fVar76;
      fVar43 = fVar76;
      fVar75 = fVar76;
      local_af8 = uVar35;
      local_af0 = uVar33;
      local_ae8 = uVar30;
      local_ae0 = ray;
      local_ad8 = context;
      local_950 = fVar76;
      fStack_94c = fVar76;
      fStack_948 = fVar76;
      fStack_944 = fVar76;
      do {
        if (puVar32 == local_800) {
          return;
        }
        uVar38 = puVar32[-1];
        puVar32 = puVar32 + -1;
        do {
          if ((uVar38 & 8) == 0) {
            auVar44 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar30),auVar120._0_16_
                                     );
            auVar44 = vmulps_avx512vl(auVar123._0_16_,auVar44);
            auVar49 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar33),auVar121._0_16_
                                     );
            auVar49 = vmulps_avx512vl(auVar124._0_16_,auVar49);
            auVar44 = vmaxps_avx(auVar44,auVar49);
            auVar49 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar35),auVar122._0_16_
                                     );
            auVar49 = vmulps_avx512vl(auVar125._0_16_,auVar49);
            auVar45 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar39),auVar120._0_16_
                                     );
            auVar91._0_4_ = fVar76 * auVar45._0_4_;
            auVar91._4_4_ = fVar88 * auVar45._4_4_;
            auVar91._8_4_ = fVar43 * auVar45._8_4_;
            auVar91._12_4_ = fVar75 * auVar45._12_4_;
            auVar45 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar40),auVar121._0_16_
                                     );
            auVar100._0_4_ = auVar115._0_4_ * auVar45._0_4_;
            auVar100._4_4_ = auVar115._4_4_ * auVar45._4_4_;
            auVar100._8_4_ = auVar115._8_4_ * auVar45._8_4_;
            auVar100._12_4_ = auVar115._12_4_ * auVar45._12_4_;
            auVar45 = vminps_avx(auVar91,auVar100);
            auVar47 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar29),auVar122._0_16_
                                     );
            auVar101._0_4_ = auVar116._0_4_ * auVar47._0_4_;
            auVar101._4_4_ = auVar116._4_4_ * auVar47._4_4_;
            auVar101._8_4_ = auVar116._8_4_ * auVar47._8_4_;
            auVar101._12_4_ = auVar116._12_4_ * auVar47._12_4_;
            auVar49 = vmaxps_avx(auVar49,auVar118._0_16_);
            auVar44 = vmaxps_avx(auVar44,auVar49);
            auVar49 = vminps_avx(auVar101,auVar119._0_16_);
            auVar49 = vminps_avx(auVar45,auVar49);
            uVar14 = vcmpps_avx512vl(auVar44,auVar49,2);
            unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),(uint)(byte)uVar14);
          }
          if ((uVar38 & 8) == 0) {
            if (unaff_R14 == 0) {
              iVar24 = 4;
            }
            else {
              uVar37 = uVar38 & 0xfffffffffffffff0;
              lVar25 = 0;
              for (uVar38 = unaff_R14; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000)
              {
                lVar25 = lVar25 + 1;
              }
              iVar24 = 0;
              for (uVar26 = unaff_R14 - 1 & unaff_R14; uVar38 = *(ulong *)(uVar37 + lVar25 * 8),
                  uVar26 != 0; uVar26 = uVar26 - 1 & uVar26) {
                *puVar32 = uVar38;
                puVar32 = puVar32 + 1;
                lVar25 = 0;
                for (uVar38 = uVar26; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000)
                {
                  lVar25 = lVar25 + 1;
                }
              }
            }
          }
          else {
            iVar24 = 6;
          }
        } while (iVar24 == 0);
        if (iVar24 == 6) {
          local_aa0 = (ulong)((uint)uVar38 & 0xf) - 8;
          bVar41 = local_aa0 != 0;
          if (bVar41) {
            uVar38 = uVar38 & 0xfffffffffffffff0;
            local_a60 = 0;
            do {
              lVar25 = local_a60 * 0x58;
              local_a58 = uVar38 + lVar25;
              auVar49._8_8_ = 0;
              auVar49._0_8_ = *(ulong *)(uVar38 + 0x20 + lVar25);
              auVar84._8_8_ = 0;
              auVar84._0_8_ = *(ulong *)(uVar38 + 0x24 + lVar25);
              uVar37 = vpcmpub_avx512vl(auVar49,auVar84,2);
              uVar99 = *(undefined4 *)(uVar38 + 0x38 + lVar25);
              auVar81._4_4_ = uVar99;
              auVar81._0_4_ = uVar99;
              auVar81._8_4_ = uVar99;
              auVar81._12_4_ = uVar99;
              uVar99 = *(undefined4 *)(uVar38 + 0x44 + lVar25);
              auVar85._4_4_ = uVar99;
              auVar85._0_4_ = uVar99;
              auVar85._8_4_ = uVar99;
              auVar85._12_4_ = uVar99;
              auVar92._8_8_ = 0;
              auVar92._0_8_ = *(ulong *)(local_a70 + 0x20 + local_a58);
              auVar44 = vpmovzxbd_avx(auVar92);
              auVar44 = vcvtdq2ps_avx(auVar44);
              auVar49 = vfmadd213ps_fma(auVar44,auVar85,auVar81);
              auVar102._8_8_ = 0;
              auVar102._0_8_ = *(ulong *)(local_a78 + 0x20 + local_a58);
              auVar44 = vpmovzxbd_avx(auVar102);
              auVar44 = vcvtdq2ps_avx(auVar44);
              auVar45 = vfmadd213ps_fma(auVar44,auVar85,auVar81);
              uVar99 = *(undefined4 *)(uVar38 + 0x3c + lVar25);
              auVar82._4_4_ = uVar99;
              auVar82._0_4_ = uVar99;
              auVar82._8_4_ = uVar99;
              auVar82._12_4_ = uVar99;
              uVar99 = *(undefined4 *)(uVar38 + 0x48 + lVar25);
              auVar86._4_4_ = uVar99;
              auVar86._0_4_ = uVar99;
              auVar86._8_4_ = uVar99;
              auVar86._12_4_ = uVar99;
              auVar106._8_8_ = 0;
              auVar106._0_8_ = *(ulong *)(local_a80 + 0x20 + local_a58);
              auVar44 = vpmovzxbd_avx(auVar106);
              auVar44 = vcvtdq2ps_avx(auVar44);
              auVar47 = vfmadd213ps_fma(auVar44,auVar86,auVar82);
              auVar109._8_8_ = 0;
              auVar109._0_8_ = *(ulong *)(local_a88 + 0x20 + local_a58);
              auVar44 = vpmovzxbd_avx(auVar109);
              auVar44 = vcvtdq2ps_avx(auVar44);
              auVar48 = vfmadd213ps_fma(auVar44,auVar86,auVar82);
              uVar99 = *(undefined4 *)(uVar38 + 0x40 + lVar25);
              auVar83._4_4_ = uVar99;
              auVar83._0_4_ = uVar99;
              auVar83._8_4_ = uVar99;
              auVar83._12_4_ = uVar99;
              uVar99 = *(undefined4 *)(uVar38 + 0x4c + lVar25);
              auVar87._4_4_ = uVar99;
              auVar87._0_4_ = uVar99;
              auVar87._8_4_ = uVar99;
              auVar87._12_4_ = uVar99;
              auVar110._8_8_ = 0;
              auVar110._0_8_ = *(ulong *)(local_a90 + 0x20 + local_a58);
              auVar44 = vpmovzxbd_avx(auVar110);
              auVar44 = vcvtdq2ps_avx(auVar44);
              auVar46 = vfmadd213ps_fma(auVar44,auVar87,auVar83);
              auVar112._8_8_ = 0;
              auVar112._0_8_ = *(ulong *)(local_a98 + 0x20 + local_a58);
              auVar44 = vpmovzxbd_avx(auVar112);
              auVar44 = vcvtdq2ps_avx(auVar44);
              auVar105 = vfmadd213ps_fma(auVar44,auVar87,auVar83);
              auVar44 = vsubps_avx512vl(auVar49,auVar120._0_16_);
              auVar44 = vmulps_avx512vl(auVar123._0_16_,auVar44);
              auVar49 = vsubps_avx512vl(auVar47,auVar121._0_16_);
              auVar49 = vmulps_avx512vl(auVar124._0_16_,auVar49);
              auVar44 = vmaxps_avx(auVar44,auVar49);
              auVar49 = vsubps_avx512vl(auVar46,auVar122._0_16_);
              auVar49 = vmulps_avx512vl(auVar125._0_16_,auVar49);
              auVar45 = vsubps_avx512vl(auVar45,auVar120._0_16_);
              auVar93._0_4_ = fVar76 * auVar45._0_4_;
              auVar93._4_4_ = fVar88 * auVar45._4_4_;
              auVar93._8_4_ = fVar43 * auVar45._8_4_;
              auVar93._12_4_ = fVar75 * auVar45._12_4_;
              auVar45 = vsubps_avx512vl(auVar48,auVar121._0_16_);
              auVar103._0_4_ = auVar115._0_4_ * auVar45._0_4_;
              auVar103._4_4_ = auVar115._4_4_ * auVar45._4_4_;
              auVar103._8_4_ = auVar115._8_4_ * auVar45._8_4_;
              auVar103._12_4_ = auVar115._12_4_ * auVar45._12_4_;
              auVar45 = vminps_avx(auVar93,auVar103);
              auVar47 = vsubps_avx512vl(auVar105,auVar122._0_16_);
              auVar104._0_4_ = auVar116._0_4_ * auVar47._0_4_;
              auVar104._4_4_ = auVar116._4_4_ * auVar47._4_4_;
              auVar104._8_4_ = auVar116._8_4_ * auVar47._8_4_;
              auVar104._12_4_ = auVar116._12_4_ * auVar47._12_4_;
              auVar49 = vmaxps_avx(auVar49,auVar118._0_16_);
              auVar44 = vmaxps_avx(auVar44,auVar49);
              auVar49 = vminps_avx(auVar104,auVar119._0_16_);
              auVar49 = vminps_avx(auVar45,auVar49);
              local_a68 = vcmpps_avx512vl(auVar44,auVar49,2);
              local_a68 = uVar37 & 0xff & local_a68;
              if ((char)local_a68 != '\0') {
                pSVar36 = local_ad8->scene;
                local_ad0 = pSVar36;
                local_ac8 = puVar32;
                do {
                  lVar25 = 0;
                  for (uVar30 = local_a68; (uVar30 & 1) == 0;
                      uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                    lVar25 = lVar25 + 1;
                  }
                  uVar9 = *(ushort *)(local_a58 + lVar25 * 8);
                  uVar10 = *(ushort *)(local_a58 + 2 + lVar25 * 8);
                  local_ab0 = (ulong)*(uint *)(local_a58 + 0x50);
                  local_aa8 = (ulong)*(uint *)(local_a58 + 4 + lVar25 * 8);
                  pGVar27 = (pSVar36->geometries).items[local_ab0].ptr;
                  lVar25 = *(long *)&pGVar27->field_0x58;
                  lVar12 = *(long *)&pGVar27[1].time_range.upper;
                  lVar34 = pGVar27[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_aa8;
                  uVar11 = *(uint *)(lVar25 + 4 + lVar34);
                  uVar33 = (ulong)uVar11;
                  uVar35 = (ulong)(uVar11 * (uVar10 & 0x7fff) +
                                  *(int *)(lVar25 + lVar34) + (uVar9 & 0x7fff));
                  p_Var13 = pGVar27[1].intersectionFilterN;
                  auVar44 = *(undefined1 (*) [16])(lVar12 + (uVar35 + 1) * (long)p_Var13);
                  auVar49 = *(undefined1 (*) [16])(lVar12 + (uVar35 + uVar33) * (long)p_Var13);
                  lVar28 = uVar35 + uVar33 + 1;
                  auVar45 = *(undefined1 (*) [16])(lVar12 + lVar28 * (long)p_Var13);
                  uVar30 = (ulong)(-1 < (short)uVar9);
                  auVar47 = *(undefined1 (*) [16])(lVar12 + (uVar35 + uVar30 + 1) * (long)p_Var13);
                  lVar31 = uVar30 + lVar28;
                  auVar48 = *(undefined1 (*) [16])(lVar12 + lVar31 * (long)p_Var13);
                  uVar30 = 0;
                  if (-1 < (short)uVar10) {
                    uVar30 = uVar33;
                  }
                  auVar46 = *(undefined1 (*) [16])
                             (lVar12 + (uVar35 + uVar33 + uVar30) * (long)p_Var13);
                  auVar105 = *(undefined1 (*) [16])(lVar12 + (lVar28 + uVar30) * (long)p_Var13);
                  auVar59._16_16_ =
                       *(undefined1 (*) [16])(lVar12 + (uVar30 + lVar31) * (long)p_Var13);
                  auVar59._0_16_ = auVar45;
                  auVar100 = vunpcklps_avx(auVar44,auVar48);
                  auVar91 = vunpckhps_avx(auVar44,auVar48);
                  auVar101 = vunpcklps_avx(auVar47,auVar45);
                  auVar47 = vunpckhps_avx(auVar47,auVar45);
                  auVar81 = vunpcklps_avx(auVar91,auVar47);
                  auVar82 = vunpcklps_avx(auVar100,auVar101);
                  auVar47 = vunpckhps_avx(auVar100,auVar101);
                  auVar100 = vunpcklps_avx(auVar49,auVar105);
                  auVar91 = vunpckhps_avx(auVar49,auVar105);
                  auVar101 = vunpcklps_avx(auVar45,auVar46);
                  auVar46 = vunpckhps_avx(auVar45,auVar46);
                  auVar91 = vunpcklps_avx(auVar91,auVar46);
                  auVar83 = vunpcklps_avx(auVar100,auVar101);
                  auVar46 = vunpckhps_avx(auVar100,auVar101);
                  auVar56._16_16_ = auVar105;
                  auVar56._0_16_ = auVar49;
                  auVar54._16_16_ = auVar48;
                  auVar54._0_16_ = auVar44;
                  auVar74 = vunpcklps_avx(auVar54,auVar56);
                  auVar51._16_16_ = auVar45;
                  auVar51._0_16_ = *(undefined1 (*) [16])(lVar12 + (long)p_Var13 * uVar35);
                  auVar73 = vunpcklps_avx(auVar51,auVar59);
                  auVar70 = vunpcklps_avx(auVar73,auVar74);
                  auVar73 = vunpckhps_avx(auVar73,auVar74);
                  auVar74 = vunpckhps_avx(auVar54,auVar56);
                  auVar69 = vunpckhps_avx(auVar51,auVar59);
                  auVar69 = vunpcklps_avx(auVar69,auVar74);
                  auVar55._16_16_ = auVar82;
                  auVar55._0_16_ = auVar82;
                  auVar57._16_16_ = auVar47;
                  auVar57._0_16_ = auVar47;
                  auVar58._16_16_ = auVar81;
                  auVar58._0_16_ = auVar81;
                  auVar60._16_16_ = auVar83;
                  auVar60._0_16_ = auVar83;
                  auVar61._16_16_ = auVar46;
                  auVar61._0_16_ = auVar46;
                  auVar62._16_16_ = auVar91;
                  auVar62._0_16_ = auVar91;
                  uVar99 = *(undefined4 *)&(local_ae0->org).field_0;
                  auVar63._4_4_ = uVar99;
                  auVar63._0_4_ = uVar99;
                  auVar63._8_4_ = uVar99;
                  auVar63._12_4_ = uVar99;
                  auVar63._16_4_ = uVar99;
                  auVar63._20_4_ = uVar99;
                  auVar63._24_4_ = uVar99;
                  auVar63._28_4_ = uVar99;
                  uVar99 = *(undefined4 *)((long)&(local_ae0->org).field_0 + 4);
                  auVar64._4_4_ = uVar99;
                  auVar64._0_4_ = uVar99;
                  auVar64._8_4_ = uVar99;
                  auVar64._12_4_ = uVar99;
                  auVar64._16_4_ = uVar99;
                  auVar64._20_4_ = uVar99;
                  auVar64._24_4_ = uVar99;
                  auVar64._28_4_ = uVar99;
                  auVar50 = vbroadcastss_avx512vl(ZEXT416((uint)(local_ae0->org).field_0.m128[2]));
                  uVar99 = *(undefined4 *)&(local_ae0->dir).field_0;
                  auVar111._4_4_ = uVar99;
                  auVar111._0_4_ = uVar99;
                  auVar111._8_4_ = uVar99;
                  auVar111._12_4_ = uVar99;
                  auVar111._16_4_ = uVar99;
                  auVar111._20_4_ = uVar99;
                  auVar111._24_4_ = uVar99;
                  auVar111._28_4_ = uVar99;
                  uVar99 = *(undefined4 *)((long)&(local_ae0->dir).field_0 + 4);
                  auVar113._4_4_ = uVar99;
                  auVar113._0_4_ = uVar99;
                  auVar113._8_4_ = uVar99;
                  auVar113._12_4_ = uVar99;
                  auVar113._16_4_ = uVar99;
                  auVar113._20_4_ = uVar99;
                  auVar113._24_4_ = uVar99;
                  auVar113._28_4_ = uVar99;
                  fVar88 = (local_ae0->dir).field_0.m128[2];
                  auVar117._4_4_ = fVar88;
                  auVar117._0_4_ = fVar88;
                  auVar117._8_4_ = fVar88;
                  auVar117._12_4_ = fVar88;
                  auVar117._16_4_ = fVar88;
                  auVar117._20_4_ = fVar88;
                  auVar117._24_4_ = fVar88;
                  auVar117._28_4_ = fVar88;
                  auVar74 = vsubps_avx(auVar70,auVar63);
                  auVar73 = vsubps_avx(auVar73,auVar64);
                  auVar51 = vsubps_avx512vl(auVar69,auVar50);
                  auVar69 = vsubps_avx(auVar55,auVar63);
                  auVar70 = vsubps_avx(auVar57,auVar64);
                  auVar52 = vsubps_avx512vl(auVar58,auVar50);
                  auVar53 = vsubps_avx512vl(auVar60,auVar63);
                  auVar54 = vsubps_avx512vl(auVar61,auVar64);
                  auVar55 = vsubps_avx512vl(auVar62,auVar50);
                  auVar56 = vsubps_avx512vl(auVar53,auVar74);
                  auVar57 = vsubps_avx512vl(auVar54,auVar73);
                  auVar58 = vsubps_avx512vl(auVar55,auVar51);
                  auVar59 = vsubps_avx512vl(auVar74,auVar69);
                  auVar60 = vsubps_avx512vl(auVar73,auVar70);
                  auVar61 = vsubps_avx512vl(auVar51,auVar52);
                  auVar62 = vsubps_avx512vl(auVar69,auVar53);
                  auVar63 = vsubps_avx512vl(auVar70,auVar54);
                  auVar64 = vsubps_avx512vl(auVar52,auVar55);
                  auVar65 = vaddps_avx512vl(auVar53,auVar74);
                  auVar66 = vaddps_avx512vl(auVar54,auVar73);
                  auVar50 = vaddps_avx512vl(auVar55,auVar51);
                  auVar67 = vmulps_avx512vl(auVar66,auVar58);
                  auVar67 = vfmsub231ps_avx512vl(auVar67,auVar57,auVar50);
                  auVar50 = vmulps_avx512vl(auVar50,auVar56);
                  auVar68 = vfmsub231ps_avx512vl(auVar50,auVar58,auVar65);
                  auVar50._4_4_ = auVar65._4_4_ * auVar57._4_4_;
                  auVar50._0_4_ = auVar65._0_4_ * auVar57._0_4_;
                  auVar50._8_4_ = auVar65._8_4_ * auVar57._8_4_;
                  auVar50._12_4_ = auVar65._12_4_ * auVar57._12_4_;
                  auVar50._16_4_ = auVar65._16_4_ * auVar57._16_4_;
                  auVar50._20_4_ = auVar65._20_4_ * auVar57._20_4_;
                  auVar50._24_4_ = auVar65._24_4_ * auVar57._24_4_;
                  auVar50._28_4_ = auVar65._28_4_;
                  auVar44 = vfmsub231ps_fma(auVar50,auVar56,auVar66);
                  auVar66._0_4_ = fVar88 * auVar44._0_4_;
                  auVar66._4_4_ = fVar88 * auVar44._4_4_;
                  auVar66._8_4_ = fVar88 * auVar44._8_4_;
                  auVar66._12_4_ = fVar88 * auVar44._12_4_;
                  auVar66._16_4_ = fVar88 * 0.0;
                  auVar66._20_4_ = fVar88 * 0.0;
                  auVar66._24_4_ = fVar88 * 0.0;
                  auVar66._28_4_ = 0;
                  auVar50 = vfmadd231ps_avx512vl(auVar66,auVar113,auVar68);
                  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar111,auVar67);
                  auVar68._0_4_ = auVar74._0_4_ + auVar69._0_4_;
                  auVar68._4_4_ = auVar74._4_4_ + auVar69._4_4_;
                  auVar68._8_4_ = auVar74._8_4_ + auVar69._8_4_;
                  auVar68._12_4_ = auVar74._12_4_ + auVar69._12_4_;
                  auVar68._16_4_ = auVar74._16_4_ + auVar69._16_4_;
                  auVar68._20_4_ = auVar74._20_4_ + auVar69._20_4_;
                  auVar68._24_4_ = auVar74._24_4_ + auVar69._24_4_;
                  auVar68._28_4_ = auVar74._28_4_ + auVar69._28_4_;
                  auVar65 = vaddps_avx512vl(auVar73,auVar70);
                  auVar66 = vaddps_avx512vl(auVar51,auVar52);
                  auVar67 = vmulps_avx512vl(auVar65,auVar61);
                  auVar67 = vfmsub231ps_avx512vl(auVar67,auVar60,auVar66);
                  auVar66 = vmulps_avx512vl(auVar66,auVar59);
                  auVar66 = vfmsub231ps_avx512vl(auVar66,auVar61,auVar68);
                  auVar68 = vmulps_avx512vl(auVar68,auVar60);
                  auVar68 = vfmsub231ps_avx512vl(auVar68,auVar59,auVar65);
                  auVar65._4_4_ = fVar88 * auVar68._4_4_;
                  auVar65._0_4_ = fVar88 * auVar68._0_4_;
                  auVar65._8_4_ = fVar88 * auVar68._8_4_;
                  auVar65._12_4_ = fVar88 * auVar68._12_4_;
                  auVar65._16_4_ = fVar88 * auVar68._16_4_;
                  auVar65._20_4_ = fVar88 * auVar68._20_4_;
                  auVar65._24_4_ = fVar88 * auVar68._24_4_;
                  auVar65._28_4_ = auVar68._28_4_;
                  auVar65 = vfmadd231ps_avx512vl(auVar65,auVar113,auVar66);
                  auVar65 = vfmadd231ps_avx512vl(auVar65,auVar111,auVar67);
                  auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar69 = vaddps_avx512vl(auVar69,auVar53);
                  auVar70 = vaddps_avx512vl(auVar70,auVar54);
                  auVar52 = vaddps_avx512vl(auVar52,auVar55);
                  auVar53 = vmulps_avx512vl(auVar70,auVar64);
                  auVar53 = vfmsub231ps_avx512vl(auVar53,auVar63,auVar52);
                  auVar52 = vmulps_avx512vl(auVar52,auVar62);
                  auVar54 = vfmsub231ps_avx512vl(auVar52,auVar64,auVar69);
                  auVar52._4_4_ = auVar69._4_4_ * auVar63._4_4_;
                  auVar52._0_4_ = auVar69._0_4_ * auVar63._0_4_;
                  auVar52._8_4_ = auVar69._8_4_ * auVar63._8_4_;
                  auVar52._12_4_ = auVar69._12_4_ * auVar63._12_4_;
                  auVar52._16_4_ = auVar69._16_4_ * auVar63._16_4_;
                  auVar52._20_4_ = auVar69._20_4_ * auVar63._20_4_;
                  auVar52._24_4_ = auVar69._24_4_ * auVar63._24_4_;
                  auVar52._28_4_ = auVar69._28_4_;
                  auVar44 = vfmsub231ps_fma(auVar52,auVar62,auVar70);
                  auVar69 = vmulps_avx512vl(auVar117,ZEXT1632(auVar44));
                  auVar69 = vfmadd231ps_avx512vl(auVar69,auVar113,auVar54);
                  auVar52 = vfmadd231ps_avx512vl(auVar69,auVar111,auVar53);
                  auVar53._0_4_ = auVar50._0_4_ + auVar65._0_4_;
                  auVar53._4_4_ = auVar50._4_4_ + auVar65._4_4_;
                  auVar53._8_4_ = auVar50._8_4_ + auVar65._8_4_;
                  auVar53._12_4_ = auVar50._12_4_ + auVar65._12_4_;
                  auVar53._16_4_ = auVar50._16_4_ + auVar65._16_4_;
                  auVar53._20_4_ = auVar50._20_4_ + auVar65._20_4_;
                  auVar53._24_4_ = auVar50._24_4_ + auVar65._24_4_;
                  auVar53._28_4_ = auVar50._28_4_ + auVar65._28_4_;
                  local_900 = vaddps_avx512vl(auVar52,auVar53);
                  vandps_avx512vl(local_900,auVar66);
                  auVar69._8_4_ = 0x34000000;
                  auVar69._0_8_ = 0x3400000034000000;
                  auVar69._12_4_ = 0x34000000;
                  auVar69._16_4_ = 0x34000000;
                  auVar69._20_4_ = 0x34000000;
                  auVar69._24_4_ = 0x34000000;
                  auVar69._28_4_ = 0x34000000;
                  auVar69 = vmulps_avx512vl(local_900,auVar69);
                  auVar70 = vminps_avx512vl(auVar50,auVar65);
                  auVar53 = vminps_avx512vl(auVar70,auVar52);
                  auVar70._8_4_ = 0x80000000;
                  auVar70._0_8_ = 0x8000000080000000;
                  auVar70._12_4_ = 0x80000000;
                  auVar70._16_4_ = 0x80000000;
                  auVar70._20_4_ = 0x80000000;
                  auVar70._24_4_ = 0x80000000;
                  auVar70._28_4_ = 0x80000000;
                  auVar70 = vxorps_avx512vl(auVar69,auVar70);
                  uVar14 = vcmpps_avx512vl(auVar53,auVar70,5);
                  auVar70 = vmaxps_avx512vl(auVar50,auVar65);
                  auVar70 = vmaxps_avx512vl(auVar70,auVar52);
                  uVar15 = vcmpps_avx512vl(auVar70,auVar69,2);
                  local_8d8 = (byte)uVar14 | (byte)uVar15;
                  ray = local_ae0;
                  puVar32 = local_ac8;
                  uVar30 = local_ae8;
                  uVar33 = local_af0;
                  uVar35 = local_af8;
                  pSVar36 = local_ad0;
                  if (local_8d8 != 0) {
                    auVar69 = vmulps_avx512vl(auVar58,auVar60);
                    auVar70 = vmulps_avx512vl(auVar56,auVar61);
                    auVar52 = vmulps_avx512vl(auVar57,auVar59);
                    auVar53 = vmulps_avx512vl(auVar61,auVar63);
                    auVar54 = vmulps_avx512vl(auVar59,auVar64);
                    auVar55 = vmulps_avx512vl(auVar60,auVar62);
                    auVar57 = vfmsub213ps_avx512vl(auVar57,auVar61,auVar69);
                    auVar58 = vfmsub213ps_avx512vl(auVar58,auVar59,auVar70);
                    auVar56 = vfmsub213ps_avx512vl(auVar56,auVar60,auVar52);
                    auVar64 = vfmsub213ps_avx512vl(auVar64,auVar60,auVar53);
                    auVar61 = vfmsub213ps_avx512vl(auVar62,auVar61,auVar54);
                    auVar59 = vfmsub213ps_avx512vl(auVar63,auVar59,auVar55);
                    vandps_avx512vl(auVar69,auVar66);
                    vandps_avx512vl(auVar53,auVar66);
                    uVar37 = vcmpps_avx512vl(auVar59,auVar59,1);
                    vandps_avx512vl(auVar70,auVar66);
                    vandps_avx512vl(auVar54,auVar66);
                    uVar26 = vcmpps_avx512vl(auVar59,auVar59,1);
                    vandps_avx512vl(auVar52,auVar66);
                    vandps_avx512vl(auVar55,auVar66);
                    uVar16 = vcmpps_avx512vl(auVar59,auVar59,1);
                    bVar42 = (bool)((byte)uVar37 & 1);
                    auVar71._0_4_ =
                         (float)((uint)bVar42 * auVar57._0_4_ | (uint)!bVar42 * auVar64._0_4_);
                    bVar42 = (bool)((byte)(uVar37 >> 1) & 1);
                    auVar71._4_4_ =
                         (float)((uint)bVar42 * auVar57._4_4_ | (uint)!bVar42 * auVar64._4_4_);
                    bVar42 = (bool)((byte)(uVar37 >> 2) & 1);
                    auVar71._8_4_ =
                         (float)((uint)bVar42 * auVar57._8_4_ | (uint)!bVar42 * auVar64._8_4_);
                    bVar42 = (bool)((byte)(uVar37 >> 3) & 1);
                    auVar71._12_4_ =
                         (float)((uint)bVar42 * auVar57._12_4_ | (uint)!bVar42 * auVar64._12_4_);
                    bVar42 = (bool)((byte)(uVar37 >> 4) & 1);
                    auVar71._16_4_ =
                         (float)((uint)bVar42 * auVar57._16_4_ | (uint)!bVar42 * auVar64._16_4_);
                    bVar42 = (bool)((byte)(uVar37 >> 5) & 1);
                    auVar71._20_4_ =
                         (float)((uint)bVar42 * auVar57._20_4_ | (uint)!bVar42 * auVar64._20_4_);
                    bVar42 = (bool)((byte)(uVar37 >> 6) & 1);
                    auVar71._24_4_ =
                         (float)((uint)bVar42 * auVar57._24_4_ | (uint)!bVar42 * auVar64._24_4_);
                    bVar42 = SUB81(uVar37 >> 7,0);
                    auVar71._28_4_ = (uint)bVar42 * auVar57._28_4_ | (uint)!bVar42 * auVar64._28_4_;
                    bVar42 = (bool)((byte)uVar26 & 1);
                    auVar72._0_4_ =
                         (float)((uint)bVar42 * auVar58._0_4_ | (uint)!bVar42 * auVar61._0_4_);
                    bVar42 = (bool)((byte)(uVar26 >> 1) & 1);
                    auVar72._4_4_ =
                         (float)((uint)bVar42 * auVar58._4_4_ | (uint)!bVar42 * auVar61._4_4_);
                    bVar42 = (bool)((byte)(uVar26 >> 2) & 1);
                    auVar72._8_4_ =
                         (float)((uint)bVar42 * auVar58._8_4_ | (uint)!bVar42 * auVar61._8_4_);
                    bVar42 = (bool)((byte)(uVar26 >> 3) & 1);
                    auVar72._12_4_ =
                         (float)((uint)bVar42 * auVar58._12_4_ | (uint)!bVar42 * auVar61._12_4_);
                    bVar42 = (bool)((byte)(uVar26 >> 4) & 1);
                    auVar72._16_4_ =
                         (float)((uint)bVar42 * auVar58._16_4_ | (uint)!bVar42 * auVar61._16_4_);
                    bVar42 = (bool)((byte)(uVar26 >> 5) & 1);
                    auVar72._20_4_ =
                         (float)((uint)bVar42 * auVar58._20_4_ | (uint)!bVar42 * auVar61._20_4_);
                    bVar42 = (bool)((byte)(uVar26 >> 6) & 1);
                    auVar72._24_4_ =
                         (float)((uint)bVar42 * auVar58._24_4_ | (uint)!bVar42 * auVar61._24_4_);
                    bVar42 = SUB81(uVar26 >> 7,0);
                    auVar72._28_4_ = (uint)bVar42 * auVar58._28_4_ | (uint)!bVar42 * auVar61._28_4_;
                    bVar42 = (bool)((byte)uVar16 & 1);
                    fVar43 = (float)((uint)bVar42 * auVar56._0_4_ | (uint)!bVar42 * auVar59._0_4_);
                    bVar42 = (bool)((byte)(uVar16 >> 1) & 1);
                    fVar75 = (float)((uint)bVar42 * auVar56._4_4_ | (uint)!bVar42 * auVar59._4_4_);
                    bVar42 = (bool)((byte)(uVar16 >> 2) & 1);
                    fVar76 = (float)((uint)bVar42 * auVar56._8_4_ | (uint)!bVar42 * auVar59._8_4_);
                    bVar42 = (bool)((byte)(uVar16 >> 3) & 1);
                    fVar77 = (float)((uint)bVar42 * auVar56._12_4_ | (uint)!bVar42 * auVar59._12_4_)
                    ;
                    bVar42 = (bool)((byte)(uVar16 >> 4) & 1);
                    fVar78 = (float)((uint)bVar42 * auVar56._16_4_ | (uint)!bVar42 * auVar59._16_4_)
                    ;
                    bVar42 = (bool)((byte)(uVar16 >> 5) & 1);
                    fVar79 = (float)((uint)bVar42 * auVar56._20_4_ | (uint)!bVar42 * auVar59._20_4_)
                    ;
                    bVar42 = (bool)((byte)(uVar16 >> 6) & 1);
                    fVar80 = (float)((uint)bVar42 * auVar56._24_4_ | (uint)!bVar42 * auVar59._24_4_)
                    ;
                    bVar42 = SUB81(uVar16 >> 7,0);
                    auVar20._4_4_ = fVar88 * fVar75;
                    auVar20._0_4_ = fVar88 * fVar43;
                    auVar20._8_4_ = fVar88 * fVar76;
                    auVar20._12_4_ = fVar88 * fVar77;
                    auVar20._16_4_ = fVar88 * fVar78;
                    auVar20._20_4_ = fVar88 * fVar79;
                    auVar20._24_4_ = fVar88 * fVar80;
                    auVar20._28_4_ = fVar88;
                    auVar44 = vfmadd213ps_fma(auVar113,auVar72,auVar20);
                    auVar44 = vfmadd213ps_fma(auVar111,auVar71,ZEXT1632(auVar44));
                    auVar69 = ZEXT1632(CONCAT412(auVar44._12_4_ + auVar44._12_4_,
                                                 CONCAT48(auVar44._8_4_ + auVar44._8_4_,
                                                          CONCAT44(auVar44._4_4_ + auVar44._4_4_,
                                                                   auVar44._0_4_ + auVar44._0_4_))))
                    ;
                    auVar114._0_4_ = auVar51._0_4_ * fVar43;
                    auVar114._4_4_ = auVar51._4_4_ * fVar75;
                    auVar114._8_4_ = auVar51._8_4_ * fVar76;
                    auVar114._12_4_ = auVar51._12_4_ * fVar77;
                    auVar114._16_4_ = auVar51._16_4_ * fVar78;
                    auVar114._20_4_ = auVar51._20_4_ * fVar79;
                    auVar114._24_4_ = auVar51._24_4_ * fVar80;
                    auVar114._28_4_ = 0;
                    auVar44 = vfmadd213ps_fma(auVar73,auVar72,auVar114);
                    auVar49 = vfmadd213ps_fma(auVar74,auVar71,ZEXT1632(auVar44));
                    auVar73 = vrcp14ps_avx512vl(auVar69);
                    auVar74._8_4_ = 0x3f800000;
                    auVar74._0_8_ = &DAT_3f8000003f800000;
                    auVar74._12_4_ = 0x3f800000;
                    auVar74._16_4_ = 0x3f800000;
                    auVar74._20_4_ = 0x3f800000;
                    auVar74._24_4_ = 0x3f800000;
                    auVar74._28_4_ = 0x3f800000;
                    auVar74 = vfnmadd213ps_avx512vl(auVar73,auVar69,auVar74);
                    auVar44 = vfmadd132ps_fma(auVar74,auVar73,auVar73);
                    local_880 = ZEXT1632(CONCAT412(auVar44._12_4_ *
                                                   (auVar49._12_4_ + auVar49._12_4_),
                                                   CONCAT48(auVar44._8_4_ *
                                                            (auVar49._8_4_ + auVar49._8_4_),
                                                            CONCAT44(auVar44._4_4_ *
                                                                     (auVar49._4_4_ + auVar49._4_4_)
                                                                     ,auVar44._0_4_ *
                                                                      (auVar49._0_4_ + auVar49._0_4_
                                                                      )))));
                    uVar99 = *(undefined4 *)((long)&(local_ae0->org).field_0 + 0xc);
                    auVar73._4_4_ = uVar99;
                    auVar73._0_4_ = uVar99;
                    auVar73._8_4_ = uVar99;
                    auVar73._12_4_ = uVar99;
                    auVar73._16_4_ = uVar99;
                    auVar73._20_4_ = uVar99;
                    auVar73._24_4_ = uVar99;
                    auVar73._28_4_ = uVar99;
                    uVar14 = vcmpps_avx512vl(local_880,auVar73,0xd);
                    auVar67._8_4_ = 0x80000000;
                    auVar67._0_8_ = 0x8000000080000000;
                    auVar67._12_4_ = 0x80000000;
                    auVar67._16_4_ = 0x80000000;
                    auVar67._20_4_ = 0x80000000;
                    auVar67._24_4_ = 0x80000000;
                    auVar67._28_4_ = 0x80000000;
                    auVar74 = vxorps_avx512vl(auVar69,auVar67);
                    fVar88 = local_ae0->tfar;
                    auVar18._4_4_ = fVar88;
                    auVar18._0_4_ = fVar88;
                    auVar18._8_4_ = fVar88;
                    auVar18._12_4_ = fVar88;
                    auVar18._16_4_ = fVar88;
                    auVar18._20_4_ = fVar88;
                    auVar18._24_4_ = fVar88;
                    auVar18._28_4_ = fVar88;
                    uVar15 = vcmpps_avx512vl(local_880,auVar18,2);
                    uVar17 = vcmpps_avx512vl(auVar69,auVar74,4);
                    local_8d8 = (byte)uVar14 & (byte)uVar15 & (byte)uVar17 & local_8d8;
                    if (local_8d8 != 0) {
                      local_8e0 = &local_b1d;
                      auVar74 = vsubps_avx(local_900,auVar65);
                      auVar74 = vblendps_avx(auVar50,auVar74,0xf0);
                      auVar73 = vsubps_avx(local_900,auVar50);
                      auVar73 = vblendps_avx(auVar65,auVar73,0xf0);
                      local_860[0] = auVar71._0_4_ * 1.0;
                      local_860[1] = auVar71._4_4_ * 1.0;
                      local_860[2] = auVar71._8_4_ * 1.0;
                      local_860[3] = auVar71._12_4_ * 1.0;
                      fStack_850 = auVar71._16_4_ * -1.0;
                      fStack_84c = auVar71._20_4_ * -1.0;
                      fStack_848 = auVar71._24_4_ * -1.0;
                      uStack_844 = auVar71._28_4_;
                      local_840[0] = auVar72._0_4_ * 1.0;
                      local_840[1] = auVar72._4_4_ * 1.0;
                      local_840[2] = auVar72._8_4_ * 1.0;
                      local_840[3] = auVar72._12_4_ * 1.0;
                      fStack_830 = auVar72._16_4_ * -1.0;
                      fStack_82c = auVar72._20_4_ * -1.0;
                      fStack_828 = auVar72._24_4_ * -1.0;
                      uStack_824 = auVar72._28_4_;
                      local_820[0] = fVar43 * 1.0;
                      local_820[1] = fVar75 * 1.0;
                      local_820[2] = fVar76 * 1.0;
                      local_820[3] = fVar77 * 1.0;
                      fStack_810 = fVar78 * -1.0;
                      fStack_80c = fVar79 * -1.0;
                      fStack_808 = fVar80 * -1.0;
                      uStack_804 = (uint)bVar42 * auVar56._28_4_ | (uint)!bVar42 * auVar59._28_4_;
                      auVar69 = vpbroadcastd_avx512vl();
                      auVar69 = vpaddd_avx2(auVar69,_DAT_0205d4c0);
                      auVar70 = vpbroadcastd_avx512vl();
                      auVar70 = vpaddd_avx2(auVar70,_DAT_0205d4e0);
                      auVar107._0_4_ = (float)(int)(*(ushort *)(lVar25 + 8 + lVar34) - 1);
                      auVar107._4_12_ = auVar51._4_12_;
                      auVar23._12_4_ = 0;
                      auVar23._0_12_ = ZEXT812(0);
                      auVar49 = vrcp14ss_avx512f(auVar23 << 0x20,ZEXT416((uint)auVar107._0_4_));
                      auVar44 = vfnmadd213ss_fma(auVar107,auVar49,SUB6416(ZEXT464(0x40000000),0));
                      fVar88 = auVar49._0_4_ * auVar44._0_4_;
                      auVar44 = vcvtsi2ss_avx512f(auVar60._0_16_,
                                                  *(ushort *)(lVar25 + 10 + lVar34) - 1);
                      auVar49 = vrcp14ss_avx512f(auVar23 << 0x20,ZEXT416(auVar44._0_4_));
                      auVar44 = vfnmadd213ss_fma(auVar44,auVar49,SUB6416(ZEXT464(0x40000000),0));
                      fVar43 = auVar49._0_4_ * auVar44._0_4_;
                      auVar69 = vcvtdq2ps_avx(auVar69);
                      fVar89 = auVar69._28_4_ + auVar74._28_4_;
                      fVar75 = (local_900._0_4_ * auVar69._0_4_ + auVar74._0_4_) * fVar88;
                      fVar76 = (local_900._4_4_ * auVar69._4_4_ + auVar74._4_4_) * fVar88;
                      local_940._4_4_ = fVar76;
                      local_940._0_4_ = fVar75;
                      fVar77 = (local_900._8_4_ * auVar69._8_4_ + auVar74._8_4_) * fVar88;
                      local_940._8_4_ = fVar77;
                      fVar78 = (local_900._12_4_ * auVar69._12_4_ + auVar74._12_4_) * fVar88;
                      local_940._12_4_ = fVar78;
                      fVar79 = (local_900._16_4_ * auVar69._16_4_ + auVar74._16_4_) * fVar88;
                      local_940._16_4_ = fVar79;
                      fVar80 = (local_900._20_4_ * auVar69._20_4_ + auVar74._20_4_) * fVar88;
                      local_940._20_4_ = fVar80;
                      fVar88 = (local_900._24_4_ * auVar69._24_4_ + auVar74._24_4_) * fVar88;
                      local_940._24_4_ = fVar88;
                      local_940._28_4_ = fVar89;
                      auVar74 = vcvtdq2ps_avx(auVar70);
                      fVar90 = (local_900._0_4_ * auVar74._0_4_ + auVar73._0_4_) * fVar43;
                      fVar94 = (local_900._4_4_ * auVar74._4_4_ + auVar73._4_4_) * fVar43;
                      local_920._4_4_ = fVar94;
                      local_920._0_4_ = fVar90;
                      fVar95 = (local_900._8_4_ * auVar74._8_4_ + auVar73._8_4_) * fVar43;
                      local_920._8_4_ = fVar95;
                      fVar96 = (local_900._12_4_ * auVar74._12_4_ + auVar73._12_4_) * fVar43;
                      local_920._12_4_ = fVar96;
                      fVar97 = (local_900._16_4_ * auVar74._16_4_ + auVar73._16_4_) * fVar43;
                      local_920._16_4_ = fVar97;
                      fVar98 = (local_900._20_4_ * auVar74._20_4_ + auVar73._20_4_) * fVar43;
                      local_920._20_4_ = fVar98;
                      fVar43 = (local_900._24_4_ * auVar74._24_4_ + auVar73._24_4_) * fVar43;
                      local_920._24_4_ = fVar43;
                      local_920._28_4_ = auVar74._28_4_ + auVar73._28_4_;
                      pGVar27 = (local_ad0->geometries).items[local_ab0].ptr;
                      if ((pGVar27->mask & local_ae0->mask) != 0) {
                        local_b00 = local_ad8->args;
                        if ((local_b00->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar27->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0071eb8e:
                          auVar115 = ZEXT1664(local_960);
                          auVar116 = ZEXT1664(local_970);
                          auVar118 = ZEXT1664(local_980);
                          auVar119 = ZEXT1664(local_990);
                          fVar76 = local_950;
                          fVar88 = fStack_94c;
                          fVar43 = fStack_948;
                          fVar75 = fStack_944;
                          goto LAB_0071ebbf;
                        }
                        auVar19._8_4_ = 0x219392ef;
                        auVar19._0_8_ = 0x219392ef219392ef;
                        auVar19._12_4_ = 0x219392ef;
                        auVar19._16_4_ = 0x219392ef;
                        auVar19._20_4_ = 0x219392ef;
                        auVar19._24_4_ = 0x219392ef;
                        auVar19._28_4_ = 0x219392ef;
                        uVar37 = vcmpps_avx512vl(local_900,auVar19,5);
                        auVar74 = vrcp14ps_avx512vl(local_900);
                        auVar108._8_4_ = 0x3f800000;
                        auVar108._0_8_ = &DAT_3f8000003f800000;
                        auVar108._12_4_ = 0x3f800000;
                        auVar108._16_4_ = 0x3f800000;
                        auVar108._20_4_ = 0x3f800000;
                        auVar108._24_4_ = 0x3f800000;
                        auVar108._28_4_ = 0x3f800000;
                        auVar44 = vfnmadd213ps_fma(local_900,auVar74,auVar108);
                        auVar74 = vfmadd132ps_avx512vl(ZEXT1632(auVar44),auVar74,auVar74);
                        fVar1 = (float)((uint)((byte)uVar37 & 1) * auVar74._0_4_);
                        fVar2 = (float)((uint)((byte)(uVar37 >> 1) & 1) * auVar74._4_4_);
                        fVar3 = (float)((uint)((byte)(uVar37 >> 2) & 1) * auVar74._8_4_);
                        fVar4 = (float)((uint)((byte)(uVar37 >> 3) & 1) * auVar74._12_4_);
                        fVar5 = (float)((uint)((byte)(uVar37 >> 4) & 1) * auVar74._16_4_);
                        fVar6 = (float)((uint)((byte)(uVar37 >> 5) & 1) * auVar74._20_4_);
                        fVar7 = (float)((uint)((byte)(uVar37 >> 6) & 1) * auVar74._24_4_);
                        auVar21._4_4_ = fVar76 * fVar2;
                        auVar21._0_4_ = fVar75 * fVar1;
                        auVar21._8_4_ = fVar77 * fVar3;
                        auVar21._12_4_ = fVar78 * fVar4;
                        auVar21._16_4_ = fVar79 * fVar5;
                        auVar21._20_4_ = fVar80 * fVar6;
                        auVar21._24_4_ = fVar88 * fVar7;
                        auVar21._28_4_ = fVar89;
                        local_8c0 = vminps_avx(auVar21,auVar108);
                        auVar22._4_4_ = fVar94 * fVar2;
                        auVar22._0_4_ = fVar90 * fVar1;
                        auVar22._8_4_ = fVar95 * fVar3;
                        auVar22._12_4_ = fVar96 * fVar4;
                        auVar22._16_4_ = fVar97 * fVar5;
                        auVar22._20_4_ = fVar98 * fVar6;
                        auVar22._24_4_ = fVar43 * fVar7;
                        auVar22._28_4_ = (uint)(byte)(uVar37 >> 7) * auVar74._28_4_;
                        local_8a0 = vminps_avx(auVar22,auVar108);
                        local_b18 = (ulong)local_8d8;
                        bVar42 = local_b18 == 0;
                        if (!bVar42) {
                          local_b10 = 0;
                          for (uVar37 = local_b18; (uVar37 & 1) == 0;
                              uVar37 = uVar37 >> 1 | 0x8000000000000000) {
                            local_b10 = local_b10 + 1;
                          }
                          local_b08 = local_ad8->user;
                          local_9a0 = auVar120._0_16_;
                          local_9b0 = auVar121._0_16_;
                          local_9c0 = auVar122._0_16_;
                          local_9d0 = auVar123._0_16_;
                          local_9e0 = auVar124._0_16_;
                          local_9f0 = auVar125._0_16_;
                          local_ab8 = pGVar27;
                          do {
                            local_a44 = *(undefined4 *)(local_8c0 + local_b10 * 4);
                            local_a40 = *(undefined4 *)(local_8a0 + local_b10 * 4);
                            local_b1c = ray->tfar;
                            ray->tfar = local_860[local_b10 - 8];
                            local_a50 = local_860[local_b10];
                            local_a4c = local_840[local_b10];
                            local_a48 = local_820[local_b10];
                            local_a3c = (undefined4)local_aa8;
                            local_a38 = (undefined4)local_ab0;
                            local_a34 = local_b08->instID[0];
                            local_a30 = local_b08->instPrimID[0];
                            local_abc = -1;
                            local_a20.valid = &local_abc;
                            local_a20.geometryUserPtr = pGVar27->userPtr;
                            local_a20.context = local_b08;
                            local_a20.hit = (RTCHitN *)&local_a50;
                            local_a20.N = 1;
                            local_a20.ray = (RTCRayN *)ray;
                            if (pGVar27->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0071ea65:
                              if (local_b00->filter != (RTCFilterFunctionN)0x0) {
                                if (((local_b00->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                     != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar27->field_8).field_0x2 & 0x40) != 0)) {
                                  (*local_b00->filter)(&local_a20);
                                  auVar125 = ZEXT1664(local_9f0);
                                  auVar124 = ZEXT1664(local_9e0);
                                  auVar123 = ZEXT1664(local_9d0);
                                  auVar122 = ZEXT1664(local_9c0);
                                  auVar121 = ZEXT1664(local_9b0);
                                  auVar120 = ZEXT1664(local_9a0);
                                  pGVar27 = local_ab8;
                                  ray = local_ae0;
                                  puVar32 = local_ac8;
                                  uVar30 = local_ae8;
                                  uVar33 = local_af0;
                                  uVar35 = local_af8;
                                  pSVar36 = local_ad0;
                                }
                                if (*local_a20.valid == 0) goto LAB_0071eaf4;
                              }
                              if (!bVar42) goto LAB_0071eb8e;
                              break;
                            }
                            (*pGVar27->occlusionFilterN)(&local_a20);
                            auVar125 = ZEXT1664(local_9f0);
                            auVar124 = ZEXT1664(local_9e0);
                            auVar123 = ZEXT1664(local_9d0);
                            auVar122 = ZEXT1664(local_9c0);
                            auVar121 = ZEXT1664(local_9b0);
                            auVar120 = ZEXT1664(local_9a0);
                            pGVar27 = local_ab8;
                            ray = local_ae0;
                            puVar32 = local_ac8;
                            uVar30 = local_ae8;
                            uVar33 = local_af0;
                            uVar35 = local_af8;
                            pSVar36 = local_ad0;
                            if (*local_a20.valid != 0) goto LAB_0071ea65;
LAB_0071eaf4:
                            ray->tfar = local_b1c;
                            uVar37 = local_b10 & 0x3f;
                            local_b10 = 0;
                            local_b18 = local_b18 ^ 1L << uVar37;
                            for (uVar37 = local_b18; (uVar37 & 1) == 0;
                                uVar37 = uVar37 >> 1 | 0x8000000000000000) {
                              local_b10 = local_b10 + 1;
                            }
                            bVar42 = local_b18 == 0;
                          } while (!bVar42);
                        }
                      }
                    }
                  }
                  local_a68 = local_a68 - 1 & local_a68;
                  auVar115 = ZEXT1664(local_960);
                  auVar116 = ZEXT1664(local_970);
                  auVar118 = ZEXT1664(local_980);
                  auVar119 = ZEXT1664(local_990);
                  fVar76 = local_950;
                  fVar88 = fStack_94c;
                  fVar43 = fStack_948;
                  fVar75 = fStack_944;
                } while (local_a68 != 0);
              }
              local_a60 = local_a60 + 1;
              bVar41 = local_a60 < local_aa0;
            } while (local_a60 != local_aa0);
          }
LAB_0071ebbf:
          iVar24 = 0;
          if (bVar41) {
            ray->tfar = -INFINITY;
            iVar24 = 3;
          }
        }
      } while (iVar24 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }